

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O0

int __thiscall
vkt::shaderexecutor::ShaderIntegerFunctionTests::init
          (ShaderIntegerFunctionTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  ShaderIntegerFunctionTests *this_local;
  
  shaderexecutor::anon_unknown_0::addFunctionCases<vkt::shaderexecutor::UaddCarryCase>
            (&this->super_TestCaseGroup,"uaddcarry",false,true,true,0x3f);
  shaderexecutor::anon_unknown_0::addFunctionCases<vkt::shaderexecutor::UsubBorrowCase>
            (&this->super_TestCaseGroup,"usubborrow",false,true,true,0x3f);
  shaderexecutor::anon_unknown_0::addFunctionCases<vkt::shaderexecutor::UmulExtendedCase>
            (&this->super_TestCaseGroup,"umulextended",false,true,false,0x3f);
  shaderexecutor::anon_unknown_0::addFunctionCases<vkt::shaderexecutor::ImulExtendedCase>
            (&this->super_TestCaseGroup,"imulextended",true,false,false,0x3f);
  shaderexecutor::anon_unknown_0::addFunctionCases<vkt::shaderexecutor::BitfieldExtractCase>
            (&this->super_TestCaseGroup,"bitfieldextract",true,true,true,0x3f);
  shaderexecutor::anon_unknown_0::addFunctionCases<vkt::shaderexecutor::BitfieldInsertCase>
            (&this->super_TestCaseGroup,"bitfieldinsert",true,true,true,0x3f);
  shaderexecutor::anon_unknown_0::addFunctionCases<vkt::shaderexecutor::BitfieldReverseCase>
            (&this->super_TestCaseGroup,"bitfieldreverse",true,true,true,0x3f);
  shaderexecutor::anon_unknown_0::addFunctionCases<vkt::shaderexecutor::BitCountCase>
            (&this->super_TestCaseGroup,"bitcount",true,true,true,0x3f);
  shaderexecutor::anon_unknown_0::addFunctionCases<vkt::shaderexecutor::FindLSBCase>
            (&this->super_TestCaseGroup,"findlsb",true,true,true,0x3f);
  shaderexecutor::anon_unknown_0::addFunctionCases<vkt::shaderexecutor::findMSBCase>
            (&this->super_TestCaseGroup,"findMSB",true,true,true,0x3f);
  return extraout_EAX;
}

Assistant:

void ShaderIntegerFunctionTests::init (void)
{
	enum
	{
		VS = (1<<glu::SHADERTYPE_VERTEX),
		FS = (1<<glu::SHADERTYPE_FRAGMENT),
		CS = (1<<glu::SHADERTYPE_COMPUTE),
		GS = (1<<glu::SHADERTYPE_GEOMETRY),
		TC = (1<<glu::SHADERTYPE_TESSELLATION_CONTROL),
		TE = (1<<glu::SHADERTYPE_TESSELLATION_EVALUATION),

		ALL_SHADERS = VS|TC|TE|GS|FS|CS
	};

	//																		Int?	Uint?	AllPrec?	Shaders
	addFunctionCases<UaddCarryCase>				(this,	"uaddcarry",		false,	true,	true,		ALL_SHADERS);
	addFunctionCases<UsubBorrowCase>			(this,	"usubborrow",		false,	true,	true,		ALL_SHADERS);
	addFunctionCases<UmulExtendedCase>			(this,	"umulextended",		false,	true,	false,		ALL_SHADERS);
	addFunctionCases<ImulExtendedCase>			(this,	"imulextended",		true,	false,	false,		ALL_SHADERS);
	addFunctionCases<BitfieldExtractCase>		(this,	"bitfieldextract",	true,	true,	true,		ALL_SHADERS);
	addFunctionCases<BitfieldInsertCase>		(this,	"bitfieldinsert",	true,	true,	true,		ALL_SHADERS);
	addFunctionCases<BitfieldReverseCase>		(this,	"bitfieldreverse",	true,	true,	true,		ALL_SHADERS);
	addFunctionCases<BitCountCase>				(this,	"bitcount",			true,	true,	true,		ALL_SHADERS);
	addFunctionCases<FindLSBCase>				(this,	"findlsb",			true,	true,	true,		ALL_SHADERS);
	addFunctionCases<findMSBCase>				(this,	"findMSB",			true,	true,	true,		ALL_SHADERS);
}